

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

bool __thiscall Context::assign(Context *this,string *name,shared_ptr<SchemeObject> *value)

{
  Context *pCVar1;
  Context *pCVar2;
  size_type sVar3;
  __shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *this_00;
  Context *pCVar4;
  
  pCVar2 = this;
  do {
    pCVar4 = pCVar2;
    pCVar1 = (Context *)
             (this->locals).
             super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (pCVar4 == pCVar1) goto LAB_001221f0;
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>
                     *)(pCVar4->locals).
                       super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next,name);
    pCVar2 = (Context *)
             (pCVar4->locals).
             super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
  } while (sVar3 == 0);
  this_00 = &std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>
                           *)(pCVar2->locals).
                             super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
                             ._M_impl._M_node._M_size,name)->
             super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&value->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>);
LAB_001221f0:
  return pCVar4 != pCVar1;
}

Assistant:

bool Context::assign(const std::string &name, const std::shared_ptr<SchemeObject> &value) const
{
    for(auto i = locals.rbegin(); i != locals.rend(); ++i)
    {
        if((*i)->count(name))
        {
            (**i)[name] = value;
            return true;
        }
    }
    return false;
}